

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
floor_function::evaluate
          (floor_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  json_type jVar2;
  reference pbVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  assertion_error *this_00;
  double __x;
  allocator<char> local_39;
  string local_38;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               &local_39);
    assertion_error::assertion_error(this_00,&local_38);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ != value) {
LAB_002c93fe:
    std::error_code::operator=(ec,invalid_type);
    pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ::null_value(context);
    return pbVar3;
  }
  pbVar4 = (ppVar1->field_1).value_;
  jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(pbVar4);
  if (jVar2 - 2 < 2) {
    local_38._M_dataplus._M_p =
         (pointer)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                            (pbVar4);
  }
  else {
    if (jVar2 != double_value) goto LAB_002c93fe;
    __x = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double(pbVar4);
    local_38._M_dataplus._M_p = (pointer)floor(__x);
  }
  pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::create_json<double>(context,(double *)&local_38);
  return pbVar4;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                switch (arg0.type())
                {
                    case json_type::uint64_value:
                    case json_type::int64_value:
                    {
                        return *context.create_json(arg0.template as<double>());
                    }
                    case json_type::double_value:
                    {
                        return *context.create_json(std::floor(arg0.template as<double>()));
                    }
                    default:
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                }
            }